

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void __thiscall Debugger::CacheValue(Debugger *this,int valueIndex,Idx<Variable> variable)

{
  lua_State *plVar1;
  int __val;
  dll_lua_setfield p_Var2;
  int iVar3;
  Variable *pVVar4;
  char *pcVar5;
  undefined1 local_60 [8];
  string key;
  int top;
  int id;
  int type;
  lua_State *L;
  int valueIndex_local;
  Debugger *this_local;
  Idx<Variable> variable_local;
  
  variable_local._0_8_ = variable._arena;
  this_local._0_4_ = variable.Raw;
  if (this->currentL != (lua_State *)0x0) {
    plVar1 = this->currentL;
    iVar3 = (*lua_type)(plVar1,valueIndex);
    __val = cacheId;
    if ((iVar3 == 7) || (iVar3 == 5)) {
      cacheId = cacheId + 1;
      pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
      pVVar4->cacheId = __val;
      key.field_2._12_4_ = (*lua_gettop)(plVar1);
      (*lua_getfield)(plVar1,LUA_REGISTRYINDEX,"_emmy_cache_table_");
      iVar3 = (*lua_type)(plVar1,-1);
      if (iVar3 == 0) {
        (*lua_settop)(plVar1,-2);
        (*lua_createtable)(plVar1,0,0);
        (*lua_setfield)(plVar1,LUA_REGISTRYINDEX,"_emmy_cache_table_");
        (*lua_getfield)(plVar1,LUA_REGISTRYINDEX,"_emmy_cache_table_");
      }
      (*lua_pushvalue)(plVar1,valueIndex);
      std::__cxx11::to_string((string *)local_60,__val);
      p_Var2 = lua_setfield;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      (*p_Var2)(plVar1,-2,pcVar5);
      (*lua_settop)(plVar1,key.field_2._12_4_);
      std::__cxx11::string::~string((string *)local_60);
    }
  }
  return;
}

Assistant:

void Debugger::CacheValue(int valueIndex, Idx<Variable> variable) const {
	if (!currentL) {
		return;
	}

	auto L = currentL;

	const int type = lua_type(L, valueIndex);
	if (type == LUA_TUSERDATA || type == LUA_TTABLE) {
		const int id = cacheId++;
		variable->cacheId = id;
		const int top = lua_gettop(L);
		lua_getfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);// 1: cacheTable|nil
		if (lua_isnil(L, -1)) {
			lua_pop(L, 1);                                       //
			lua_newtable(L);                                     // 1: {}
			lua_setfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);//
			lua_getfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);// 1: cacheTable
		}

		lua_pushvalue(L, valueIndex);// 1: cacheTable, 2: value

		// snprintf 性能不够，问题也很大，这里采用c++标准算法
		std::string key = std::to_string(id);
		lua_setfield(L, -2, key.c_str());// 1: cacheTable

		lua_settop(L, top);
	}
}